

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int newupvalue(FuncState *fs,TString *name,expdesc *v)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Proto *o;
  Upvaldesc *pUVar4;
  long lVar5;
  
  if (fs->nups != 0xff) {
    o = fs->f;
    iVar2 = o->sizeupvalues;
    if (iVar2 <= (int)(uint)fs->nups) {
      pUVar4 = (Upvaldesc *)
               luaM_growaux_(fs->ls->L,o->upvalues,&o->sizeupvalues,0x10,0xff,"upvalues");
      o->upvalues = pUVar4;
    }
    iVar3 = o->sizeupvalues;
    if (iVar2 < iVar3) {
      lVar5 = (long)iVar3 - (long)iVar2;
      pUVar4 = o->upvalues + iVar2;
      do {
        pUVar4->name = (TString *)0x0;
        pUVar4 = pUVar4 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    bVar1 = fs->nups;
    pUVar4 = o->upvalues;
    pUVar4[bVar1].instack = v->k == VLOCAL;
    pUVar4[bVar1].idx = *(lu_byte *)&v->u;
    pUVar4[bVar1].name = name;
    if (((o->marked & 4) != 0) && ((name->marked & 3) != 0)) {
      luaC_barrier_(fs->ls->L,(GCObject *)o,(GCObject *)name);
    }
    bVar1 = fs->nups;
    fs->nups = bVar1 + 1;
    return (int)bVar1;
  }
  errorlimit(fs,0xff,"upvalues");
}

Assistant:

static int newupvalue (FuncState *fs, TString *name, expdesc *v) {
  Proto *f = fs->f;
  int oldsize = f->sizeupvalues;
  checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
  luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                  Upvaldesc, MAXUPVAL, "upvalues");
  while (oldsize < f->sizeupvalues)
    f->upvalues[oldsize++].name = NULL;
  f->upvalues[fs->nups].instack = (v->k == VLOCAL);
  f->upvalues[fs->nups].idx = cast_byte(v->u.info);
  f->upvalues[fs->nups].name = name;
  luaC_objbarrier(fs->ls->L, f, name);
  return fs->nups++;
}